

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O1

void pass2_fs_dither(j_decompress_ptr cinfo,JSAMPARRAY input_buf,JSAMPARRAY output_buf,int num_rows)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  JDIMENSION JVar5;
  jpeg_color_quantizer *pjVar6;
  _func_void_j_decompress_ptr *p_Var7;
  _func_void_j_decompress_ptr *p_Var8;
  JSAMPLE *pJVar9;
  JSAMPARRAY ppJVar10;
  JSAMPROW pJVar11;
  JSAMPROW pJVar12;
  JSAMPROW pJVar13;
  byte bVar14;
  int iVar15;
  int iVar16;
  short sVar17;
  short sVar18;
  int iVar19;
  long lVar21;
  short sVar22;
  int iVar23;
  int iVar24;
  JDIMENSION JVar25;
  ulong uVar26;
  _func_void_j_decompress_ptr_boolean *p_Var27;
  uint c2;
  JSAMPROW pJVar28;
  byte *pbVar29;
  int iVar30;
  int iVar31;
  long lVar32;
  int iVar33;
  int iVar34;
  bool bVar35;
  int local_100;
  int local_fc;
  long local_c8;
  JSAMPROW local_c0;
  int iVar20;
  
  if (0 < num_rows) {
    pjVar6 = cinfo->cquantize;
    p_Var7 = pjVar6[1].finish_pass;
    p_Var8 = pjVar6[2].finish_pass;
    JVar5 = cinfo->output_width;
    pJVar9 = cinfo->sample_range_limit;
    ppJVar10 = cinfo->colormap;
    pJVar11 = *ppJVar10;
    pJVar12 = ppJVar10[1];
    pJVar13 = ppJVar10[2];
    uVar26 = 0;
    do {
      pJVar28 = input_buf[uVar26];
      local_c0 = output_buf[uVar26];
      bVar35 = *(int *)&pjVar6[2].color_quantize == 0;
      if (bVar35) {
        p_Var27 = pjVar6[2].start_pass;
        iVar19 = 3;
        local_c8 = 1;
      }
      else {
        pJVar28 = pJVar28 + (JVar5 * 3 - 3);
        p_Var27 = pjVar6[2].start_pass + (ulong)(JVar5 * 3 + 3) * 2;
        local_c0 = local_c0 + (JVar5 - 1);
        iVar19 = -3;
        local_c8 = -1;
      }
      iVar15 = 0;
      sVar22 = 0;
      *(uint *)&pjVar6[2].color_quantize = (uint)bVar35;
      if (JVar5 == 0) {
        sVar17 = 0;
        sVar18 = 0;
      }
      else {
        lVar21 = (long)iVar19;
        pbVar29 = pJVar28 + 2;
        iVar19 = 0;
        iVar23 = 0;
        local_fc = 0;
        iVar16 = 0;
        iVar20 = 0;
        local_100 = 0;
        iVar33 = 0;
        iVar30 = 0;
        JVar25 = JVar5;
        do {
          bVar1 = pJVar9[(ulong)pbVar29[-2] +
                         (long)*(int *)(p_Var8 + (long)(iVar15 + *(short *)(p_Var27 + lVar21 * 2) +
                                                        8 >> 4) * 4)];
          bVar2 = pJVar9[(ulong)pbVar29[-1] +
                         (long)*(int *)(p_Var8 + (long)(iVar19 + *(short *)(p_Var27 +
                                                                           (lVar21 + 1) * 2) + 8 >>
                                                       4) * 4)];
          bVar3 = pJVar9[(ulong)*pbVar29 +
                         (long)*(int *)(p_Var8 + (long)(iVar23 + *(short *)(p_Var27 +
                                                                           (lVar21 + 2) * 2) + 8 >>
                                                       4) * 4)];
          bVar14 = bVar2 >> 2;
          c2 = (uint)(bVar3 >> 3);
          lVar32 = (ulong)bVar14 * 0x40 + *(long *)(p_Var7 + (bVar1 & 0xfffffff8));
          if (*(short *)(lVar32 + (ulong)c2 * 2) == 0) {
            fill_inverse_cmap(cinfo,(uint)(bVar1 >> 3),(uint)bVar14,c2);
          }
          uVar4 = *(ushort *)(lVar32 + (ulong)c2 * 2);
          *local_c0 = (char)uVar4 + 0xff;
          iVar34 = (uint)bVar1 - (uint)pJVar11[(ulong)uVar4 - 1];
          iVar31 = (uint)bVar2 - (uint)pJVar12[(ulong)uVar4 - 1];
          iVar24 = (uint)bVar3 - (uint)pJVar13[(ulong)uVar4 - 1];
          *(short *)p_Var27 = (short)iVar34 * 3 + (short)iVar16;
          iVar16 = iVar34 * 5 + local_fc;
          iVar15 = iVar34 * 7;
          *(short *)(p_Var27 + 2) = (short)iVar31 * 3 + (short)iVar20;
          iVar20 = iVar31 * 5 + iVar30;
          sVar17 = (short)iVar20;
          iVar19 = iVar31 * 7;
          *(short *)(p_Var27 + 4) = (short)iVar24 * 3 + (short)local_100;
          local_100 = iVar24 * 5 + iVar33;
          sVar22 = (short)local_100;
          iVar23 = iVar24 * 7;
          local_c0 = local_c0 + local_c8;
          pbVar29 = pbVar29 + lVar21;
          p_Var27 = p_Var27 + lVar21 * 2;
          JVar25 = JVar25 - 1;
          iVar33 = iVar24;
          local_fc = iVar34;
          iVar30 = iVar31;
        } while (JVar25 != 0);
        sVar18 = (short)iVar16;
      }
      *(short *)p_Var27 = sVar18;
      *(short *)(p_Var27 + 2) = sVar17;
      *(short *)(p_Var27 + 4) = sVar22;
      uVar26 = uVar26 + 1;
    } while (uVar26 != (uint)num_rows);
  }
  return;
}

Assistant:

METHODDEF(void)
pass2_fs_dither(j_decompress_ptr cinfo, JSAMPARRAY input_buf,
                JSAMPARRAY output_buf, int num_rows)
/* This version performs Floyd-Steinberg dithering */
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr)cinfo->cquantize;
  hist3d histogram = cquantize->histogram;
  register LOCFSERROR cur0, cur1, cur2; /* current error or pixel value */
  LOCFSERROR belowerr0, belowerr1, belowerr2; /* error for pixel below cur */
  LOCFSERROR bpreverr0, bpreverr1, bpreverr2; /* error for below/prev col */
  register FSERRPTR errorptr;   /* => fserrors[] at column before current */
  JSAMPROW inptr;               /* => current input pixel */
  JSAMPROW outptr;              /* => current output pixel */
  histptr cachep;
  int dir;                      /* +1 or -1 depending on direction */
  int dir3;                     /* 3*dir, for advancing inptr & errorptr */
  int row;
  JDIMENSION col;
  JDIMENSION width = cinfo->output_width;
  JSAMPLE *range_limit = cinfo->sample_range_limit;
  int *error_limit = cquantize->error_limiter;
  JSAMPROW colormap0 = cinfo->colormap[0];
  JSAMPROW colormap1 = cinfo->colormap[1];
  JSAMPROW colormap2 = cinfo->colormap[2];
  SHIFT_TEMPS

  for (row = 0; row < num_rows; row++) {
    inptr = input_buf[row];
    outptr = output_buf[row];
    if (cquantize->on_odd_row) {
      /* work right to left in this row */
      inptr += (width - 1) * 3; /* so point to rightmost pixel */
      outptr += width - 1;
      dir = -1;
      dir3 = -3;
      errorptr = cquantize->fserrors + (width + 1) * 3; /* => entry after last column */
      cquantize->on_odd_row = FALSE; /* flip for next time */
    } else {
      /* work left to right in this row */
      dir = 1;
      dir3 = 3;
      errorptr = cquantize->fserrors; /* => entry before first real column */
      cquantize->on_odd_row = TRUE; /* flip for next time */
    }
    /* Preset error values: no error propagated to first pixel from left */
    cur0 = cur1 = cur2 = 0;
    /* and no error propagated to row below yet */
    belowerr0 = belowerr1 = belowerr2 = 0;
    bpreverr0 = bpreverr1 = bpreverr2 = 0;

    for (col = width; col > 0; col--) {
      /* curN holds the error propagated from the previous pixel on the
       * current line.  Add the error propagated from the previous line
       * to form the complete error correction term for this pixel, and
       * round the error term (which is expressed * 16) to an integer.
       * RIGHT_SHIFT rounds towards minus infinity, so adding 8 is correct
       * for either sign of the error value.
       * Note: errorptr points to *previous* column's array entry.
       */
      cur0 = RIGHT_SHIFT(cur0 + errorptr[dir3 + 0] + 8, 4);
      cur1 = RIGHT_SHIFT(cur1 + errorptr[dir3 + 1] + 8, 4);
      cur2 = RIGHT_SHIFT(cur2 + errorptr[dir3 + 2] + 8, 4);
      /* Limit the error using transfer function set by init_error_limit.
       * See comments with init_error_limit for rationale.
       */
      cur0 = error_limit[cur0];
      cur1 = error_limit[cur1];
      cur2 = error_limit[cur2];
      /* Form pixel value + error, and range-limit to 0..MAXJSAMPLE.
       * The maximum error is +- MAXJSAMPLE (or less with error limiting);
       * this sets the required size of the range_limit array.
       */
      cur0 += inptr[0];
      cur1 += inptr[1];
      cur2 += inptr[2];
      cur0 = range_limit[cur0];
      cur1 = range_limit[cur1];
      cur2 = range_limit[cur2];
      /* Index into the cache with adjusted pixel value */
      cachep =
        &histogram[cur0 >> C0_SHIFT][cur1 >> C1_SHIFT][cur2 >> C2_SHIFT];
      /* If we have not seen this color before, find nearest colormap */
      /* entry and update the cache */
      if (*cachep == 0)
        fill_inverse_cmap(cinfo, cur0 >> C0_SHIFT, cur1 >> C1_SHIFT,
                          cur2 >> C2_SHIFT);
      /* Now emit the colormap index for this cell */
      {
        register int pixcode = *cachep - 1;
        *outptr = (JSAMPLE)pixcode;
        /* Compute representation error for this pixel */
        cur0 -= colormap0[pixcode];
        cur1 -= colormap1[pixcode];
        cur2 -= colormap2[pixcode];
      }
      /* Compute error fractions to be propagated to adjacent pixels.
       * Add these into the running sums, and simultaneously shift the
       * next-line error sums left by 1 column.
       */
      {
        register LOCFSERROR bnexterr;

        bnexterr = cur0;        /* Process component 0 */
        errorptr[0] = (FSERROR)(bpreverr0 + cur0 * 3);
        bpreverr0 = belowerr0 + cur0 * 5;
        belowerr0 = bnexterr;
        cur0 *= 7;
        bnexterr = cur1;        /* Process component 1 */
        errorptr[1] = (FSERROR)(bpreverr1 + cur1 * 3);
        bpreverr1 = belowerr1 + cur1 * 5;
        belowerr1 = bnexterr;
        cur1 *= 7;
        bnexterr = cur2;        /* Process component 2 */
        errorptr[2] = (FSERROR)(bpreverr2 + cur2 * 3);
        bpreverr2 = belowerr2 + cur2 * 5;
        belowerr2 = bnexterr;
        cur2 *= 7;
      }
      /* At this point curN contains the 7/16 error value to be propagated
       * to the next pixel on the current line, and all the errors for the
       * next line have been shifted over.  We are therefore ready to move on.
       */
      inptr += dir3;            /* Advance pixel pointers to next column */
      outptr += dir;
      errorptr += dir3;         /* advance errorptr to current column */
    }
    /* Post-loop cleanup: we must unload the final error values into the
     * final fserrors[] entry.  Note we need not unload belowerrN because
     * it is for the dummy column before or after the actual array.
     */
    errorptr[0] = (FSERROR)bpreverr0; /* unload prev errs into array */
    errorptr[1] = (FSERROR)bpreverr1;
    errorptr[2] = (FSERROR)bpreverr2;
  }
}